

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O0

IAnimatedMesh * __thiscall irr::scene::CMeshCache::getMeshByName(CMeshCache *this,path *name)

{
  s32 sVar1;
  MeshEntry *pMVar2;
  MeshEntry *in_RDI;
  s32 id;
  MeshEntry e;
  path *in_stack_ffffffffffffff88;
  u32 index;
  MeshEntry *in_stack_ffffffffffffff90;
  IAnimatedMesh *pIVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  MeshEntry::MeshEntry(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  index = (u32)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  sVar1 = core::array<irr::scene::CMeshCache::MeshEntry>::binary_search
                    ((array<irr::scene::CMeshCache::MeshEntry> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  if (sVar1 == -1) {
    pIVar3 = (IAnimatedMesh *)0x0;
  }
  else {
    pMVar2 = core::array<irr::scene::CMeshCache::MeshEntry>::operator[]
                       ((array<irr::scene::CMeshCache::MeshEntry> *)in_stack_ffffffffffffff90,index)
    ;
    pIVar3 = pMVar2->Mesh;
  }
  MeshEntry::~MeshEntry((MeshEntry *)0x30461e);
  return pIVar3;
}

Assistant:

IAnimatedMesh *CMeshCache::getMeshByName(const io::path &name)
{
	MeshEntry e(name);
	s32 id = Meshes.binary_search(e);
	return (id != -1) ? Meshes[id].Mesh : 0;
}